

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void fill_ellipse(chunk_conflict *c,wchar_t y0,wchar_t x0,wchar_t y_radius,wchar_t x_radius,
                 wchar_t feat,wchar_t flag,_Bool light)

{
  undefined4 local_30;
  undefined4 local_2c;
  wchar_t x;
  wchar_t y;
  _Bool light_local;
  wchar_t feat_local;
  wchar_t x_radius_local;
  wchar_t y_radius_local;
  wchar_t x0_local;
  wchar_t y0_local;
  chunk_conflict *c_local;
  
  for (local_2c = -y_radius; local_2c <= y_radius; local_2c = local_2c + L'\x01') {
    local_30 = 0;
    while (local_30 * local_30 * y_radius * y_radius + local_2c * local_2c * x_radius * x_radius <=
           y_radius * y_radius * x_radius * x_radius) {
      local_30 = local_30 + 1;
    }
    fill_xrange(c,y0 + local_2c,x0 - local_30,x0 + local_30,feat,flag,light);
  }
  return;
}

Assistant:

void fill_ellipse(struct chunk *c, int y0, int x0, int y_radius, int x_radius,
				  int feat, int flag, bool light)
{
	int y;
	for (y = -y_radius; y <= y_radius; y++) {
		int x = 0;
		while (x * x * y_radius * y_radius + y * y * x_radius * x_radius <=
			   y_radius * y_radius * x_radius * x_radius) {
			x++;
		}

		fill_xrange(c, y0 + y, x0 - x, x0 + x, feat, flag, light);
	}
}